

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.hpp
# Opt level: O0

void __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData
          (_ItemSimilarityRecommenderData *this)

{
  _ItemSimilarityRecommenderData *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->string_id_values);
  std::vector<long,_std::allocator<long>_>::~vector(&this->integer_id_values);
  std::__cxx11::string::~string((string *)&this->item_score_output_column);
  std::__cxx11::string::~string((string *)&this->item_list_output_column);
  std::__cxx11::string::~string((string *)&this->item_data_input_column);
  std::__cxx11::string::~string((string *)&this->item_exclusion_input_column);
  std::__cxx11::string::~string((string *)&this->num_recommendations_input_column);
  std::__cxx11::string::~string((string *)&this->item_restriction_input_column);
  std::
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~map(&this->item_shift_values);
  std::
  map<unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  ::~map(&this->item_interactions);
  return;
}

Assistant:

_ItemSimilarityRecommenderData(){}